

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration.cpp
# Opt level: O0

void __thiscall
QOffscreenIntegration::QOffscreenIntegration(QOffscreenIntegration *this,QStringList *paramList)

{
  QJsonObject *__u;
  QOffscreenIntegration *in_RSI;
  QPlatformIntegration *in_RDI;
  QPlatformIntegration *other;
  QPlatformIntegration *this_00;
  long in_FS_OFFSET;
  QOffscreenIntegration *in_stack_00000010;
  QJsonObject config;
  QJsonObject *in_stack_00000158;
  QOffscreenIntegration *in_stack_00000160;
  QFontconfigDatabase *p;
  QStringList *in_stack_ffffffffffffffc0;
  QJsonObject *this_01;
  QJsonObject local_28 [8];
  undefined8 local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformIntegration::QPlatformIntegration(in_RDI);
  *(undefined ***)in_RDI = &PTR__QOffscreenIntegration_00134ef8;
  other = in_RDI + 8;
  p = (QFontconfigDatabase *)0x0;
  QScopedPointer<QPlatformFontDatabase,_QScopedPointerDeleter<QPlatformFontDatabase>_>::
  QScopedPointer((QScopedPointer<QPlatformFontDatabase,_QScopedPointerDeleter<QPlatformFontDatabase>_>
                  *)other,(QPlatformFontDatabase *)0x0);
  this_00 = in_RDI + 0x10;
  QScopedPointer<QPlatformDrag,_QScopedPointerDeleter<QPlatformDrag>_>::QScopedPointer
            ((QScopedPointer<QPlatformDrag,_QScopedPointerDeleter<QPlatformDrag>_> *)this_00,
             (QPlatformDrag *)p);
  QScopedPointer<QPlatformInputContext,_QScopedPointerDeleter<QPlatformInputContext>_>::
  QScopedPointer((QScopedPointer<QPlatformInputContext,_QScopedPointerDeleter<QPlatformInputContext>_>
                  *)(in_RDI + 0x18),(QPlatformInputContext *)p);
  QScopedPointer<QPlatformServices,_QScopedPointerDeleter<QPlatformServices>_>::QScopedPointer
            ((QScopedPointer<QPlatformServices,_QScopedPointerDeleter<QPlatformServices>_> *)
             (in_RDI + 0x20),(QPlatformServices *)p);
  QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>::
  QScopedPointer((QScopedPointer<QPlatformNativeInterface,_QScopedPointerDeleter<QPlatformNativeInterface>_>
                  *)(in_RDI + 0x28),(QPlatformNativeInterface *)p);
  QList<QOffscreenScreen_*>::QList((QList<QOffscreenScreen_*> *)0x11775a);
  in_RDI[0x48] = (QPlatformIntegration)0x1;
  QJsonObject::QJsonObject((QJsonObject *)(in_RDI + 0x50));
  __u = (QJsonObject *)operator_new(8);
  *(undefined8 *)__u = 0;
  QFontconfigDatabase::QFontconfigDatabase(p);
  QScopedPointer<QPlatformFontDatabase,_QScopedPointerDeleter<QPlatformFontDatabase>_>::reset
            ((QScopedPointer<QPlatformFontDatabase,_QScopedPointerDeleter<QPlatformFontDatabase>_> *
             )p,(QPlatformFontDatabase *)other);
  operator_new(0x10);
  QOffscreenDrag::QOffscreenDrag((QOffscreenDrag *)p);
  QScopedPointer<QPlatformDrag,_QScopedPointerDeleter<QPlatformDrag>_>::reset
            ((QScopedPointer<QPlatformDrag,_QScopedPointerDeleter<QPlatformDrag>_> *)p,
             (QPlatformDrag *)other);
  local_20[0] = 0xaaaaaaaaaaaaaaaa;
  resolveConfigFileConfiguration(in_RSI,in_stack_ffffffffffffffc0);
  defaultConfiguration(in_stack_00000010);
  this_01 = (QJsonObject *)local_20;
  std::optional<QJsonObject>::value_or<QJsonObject>((optional<QJsonObject> *)this_00,__u);
  QJsonObject::~QJsonObject(local_28);
  std::optional<QJsonObject>::~optional((optional<QJsonObject> *)0x117828);
  setConfiguration(in_stack_00000160,in_stack_00000158);
  QJsonObject::~QJsonObject(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOffscreenIntegration::QOffscreenIntegration(const QStringList& paramList)
{
#if defined(Q_OS_UNIX)
#if defined(Q_OS_MAC)
    m_fontDatabase.reset(new QCoreTextFontDatabaseEngineFactory<QCoreTextFontEngine>);
#else
    m_fontDatabase.reset(new QGenericUnixFontDatabase());
#endif
#elif defined(Q_OS_WIN)
    m_fontDatabase.reset(new QFreeTypeFontDatabase());
#endif

#if QT_CONFIG(draganddrop)
    m_drag.reset(new QOffscreenDrag);
#endif

    QJsonObject config = resolveConfigFileConfiguration(paramList).value_or(defaultConfiguration());
    setConfiguration(config);
}